

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::BVHNIntersector1<4,_16777232,_true,_embree::avx2::SubdivPatch1MBIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  RTCRayQueryContext *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  uint uVar49;
  int iVar50;
  AABBNodeMB4D *node1;
  ulong uVar51;
  uint uVar52;
  ulong uVar53;
  ulong uVar54;
  Geometry *pGVar55;
  uint uVar56;
  long lVar57;
  undefined1 (*pauVar58) [16];
  undefined1 (*pauVar59) [16];
  long lVar60;
  Primitive *prim;
  ulong uVar61;
  undefined1 (*pauVar62) [16];
  undefined1 auVar63 [8];
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  undefined4 uVar67;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar107;
  float fVar115;
  float fVar116;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar110 [32];
  float fVar117;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  float fVar145;
  float fVar146;
  undefined1 auVar144 [32];
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar148 [64];
  undefined1 auVar155 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MapUV<embree::avx2::GridSOA::Gather3x3> mapUV;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_14ac;
  long local_14a8;
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined1 local_1480 [32];
  long local_1460;
  long local_1458;
  RTCFilterFunctionNArguments local_1450;
  undefined1 local_1420 [8];
  undefined1 auStack_1418 [8];
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  float local_1380;
  undefined4 local_137c;
  undefined4 local_1378;
  float local_1374;
  float local_1370;
  undefined4 local_136c;
  undefined4 local_1368;
  uint local_1364;
  uint local_1360;
  undefined1 local_1350 [16];
  undefined1 (*local_1338) [16];
  ulong local_1330;
  ulong local_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined4 local_1240;
  undefined4 uStack_123c;
  undefined4 uStack_1238;
  undefined4 uStack_1234;
  undefined4 uStack_1230;
  undefined4 uStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [16];
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 (**local_11c0) [16];
  undefined1 local_11a0 [32];
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined1 local_fc0 [32];
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar76 [64];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 == 8) {
    return;
  }
  pauVar59 = (undefined1 (*) [16])local_f90;
  uStack_f98 = 0;
  aVar1 = (ray->super_RayK<1>).dir.field_0;
  auVar80 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar88 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  auVar81._8_4_ = 0x7fffffff;
  auVar81._0_8_ = 0x7fffffff7fffffff;
  auVar81._12_4_ = 0x7fffffff;
  auVar81 = vandps_avx((undefined1  [16])aVar1,auVar81);
  auVar99._8_4_ = 0x219392ef;
  auVar99._0_8_ = 0x219392ef219392ef;
  auVar99._12_4_ = 0x219392ef;
  auVar81 = vcmpps_avx(auVar81,auVar99,1);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar99 = vdivps_avx(auVar100,(undefined1  [16])aVar1);
  auVar101._8_4_ = 0x5d5e0b6b;
  auVar101._0_8_ = 0x5d5e0b6b5d5e0b6b;
  auVar101._12_4_ = 0x5d5e0b6b;
  auVar81 = vblendvps_avx(auVar99,auVar101,auVar81);
  auVar93._0_4_ = auVar81._0_4_ * 0.99999964;
  auVar93._4_4_ = auVar81._4_4_ * 0.99999964;
  auVar93._8_4_ = auVar81._8_4_ * 0.99999964;
  auVar93._12_4_ = auVar81._12_4_ * 0.99999964;
  auVar87._0_4_ = auVar81._0_4_ * 1.0000004;
  auVar87._4_4_ = auVar81._4_4_ * 1.0000004;
  auVar87._8_4_ = auVar81._8_4_ * 1.0000004;
  auVar87._12_4_ = auVar81._12_4_ * 1.0000004;
  uVar67 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  local_1250._4_4_ = uVar67;
  local_1250._0_4_ = uVar67;
  local_1250._8_4_ = uVar67;
  local_1250._12_4_ = uVar67;
  auVar129 = ZEXT1664(local_1250);
  uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  local_1260._4_4_ = uVar67;
  local_1260._0_4_ = uVar67;
  local_1260._8_4_ = uVar67;
  local_1260._12_4_ = uVar67;
  auVar132 = ZEXT1664(local_1260);
  uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_1270._4_4_ = uVar67;
  local_1270._0_4_ = uVar67;
  local_1270._8_4_ = uVar67;
  local_1270._12_4_ = uVar67;
  auVar134 = ZEXT1664(local_1270);
  auVar81 = vmovshdup_avx(auVar93);
  local_1290 = vshufps_avx(auVar93,auVar93,0x55);
  auVar140 = ZEXT1664(local_1290);
  auVar99 = vshufpd_avx(auVar93,auVar93,1);
  local_12a0 = vshufps_avx(auVar93,auVar93,0xaa);
  auVar143 = ZEXT1664(local_12a0);
  local_12c0 = vshufps_avx(auVar87,auVar87,0x55);
  auVar148 = ZEXT1664(local_12c0);
  uVar64 = (ulong)(auVar93._0_4_ < 0.0) * 0x10;
  local_12d0 = vshufps_avx(auVar87,auVar87,0xaa);
  auVar155 = ZEXT1664(local_12d0);
  uVar66 = (ulong)(auVar81._0_4_ < 0.0) << 4 | 0x20;
  uVar65 = (ulong)(auVar99._0_4_ < 0.0) << 4 | 0x40;
  uVar67 = auVar80._0_4_;
  local_1350._4_4_ = uVar67;
  local_1350._0_4_ = uVar67;
  local_1350._8_4_ = uVar67;
  local_1350._12_4_ = uVar67;
  auVar125 = ZEXT1664(local_1350);
  iVar50 = 0x2223f80;
  local_1240 = mm_lookupmask_pd._0_4_;
  uStack_123c = mm_lookupmask_pd._4_4_;
  uStack_1238 = mm_lookupmask_pd._8_4_;
  uStack_1234 = mm_lookupmask_pd._12_4_;
  uStack_1230 = mm_lookupmask_pd._0_4_;
  uStack_122c = mm_lookupmask_pd._4_4_;
  uStack_1228 = mm_lookupmask_pd._8_4_;
  uStack_1224 = mm_lookupmask_pd._12_4_;
  uVar67 = auVar88._0_4_;
  auVar76 = ZEXT1664(CONCAT412(uVar67,CONCAT48(uVar67,CONCAT44(uVar67,uVar67))));
  local_14a8 = 0;
  local_1280 = auVar93._0_4_;
  fStack_127c = auVar93._0_4_;
  fStack_1278 = auVar93._0_4_;
  fStack_1274 = auVar93._0_4_;
  local_12b0 = auVar87._0_4_;
  fStack_12ac = auVar87._0_4_;
  fStack_12a8 = auVar87._0_4_;
  fStack_12a4 = auVar87._0_4_;
  local_10a0 = (float)mm_lookupmask_pd._0_4_;
  fVar136 = auVar93._0_4_;
  fVar137 = auVar93._0_4_;
  fVar138 = auVar93._0_4_;
  fVar145 = auVar87._0_4_;
  fVar146 = auVar87._0_4_;
  fVar107 = auVar87._0_4_;
  do {
    local_1458 = (long)iVar50;
    local_1460 = local_14a8 + 0x30;
    fStack_109c = local_10a0;
    fStack_1098 = local_10a0;
    fStack_1094 = local_10a0;
    fStack_1090 = local_10a0;
    fStack_108c = local_10a0;
    fStack_1088 = local_10a0;
    fStack_1084 = local_10a0;
    local_10c0 = 1.0 - local_10a0;
    fStack_10bc = local_10c0;
    fStack_10b8 = local_10c0;
    fStack_10b4 = local_10c0;
    fStack_10b0 = local_10c0;
    fStack_10ac = local_10c0;
    fStack_10a8 = local_10c0;
    fStack_10a4 = local_10c0;
LAB_01499609:
    do {
      if (pauVar59 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar58 = pauVar59 + -1;
      pauVar59 = pauVar59 + -1;
    } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar58 + 8));
    uVar61 = *(ulong *)*pauVar59;
    while ((uVar61 & 8) == 0) {
      uVar51 = uVar61 & 0xfffffffffffffff0;
      uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
      auVar80._4_4_ = uVar67;
      auVar80._0_4_ = uVar67;
      auVar80._8_4_ = uVar67;
      auVar80._12_4_ = uVar67;
      auVar81 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar51 + 0x80 + uVar64),auVar80,
                                *(undefined1 (*) [16])(uVar51 + 0x20 + uVar64));
      auVar81 = vsubps_avx(auVar81,auVar129._0_16_);
      auVar88._0_4_ = auVar93._0_4_ * auVar81._0_4_;
      auVar88._4_4_ = fVar136 * auVar81._4_4_;
      auVar88._8_4_ = fVar137 * auVar81._8_4_;
      auVar88._12_4_ = fVar138 * auVar81._12_4_;
      auVar81 = vmaxps_avx(auVar125._0_16_,auVar88);
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar51 + 0x80 + uVar66),auVar80,
                                *(undefined1 (*) [16])(uVar51 + 0x20 + uVar66));
      auVar99 = vsubps_avx(auVar99,auVar132._0_16_);
      auVar94._0_4_ = auVar140._0_4_ * auVar99._0_4_;
      auVar94._4_4_ = auVar140._4_4_ * auVar99._4_4_;
      auVar94._8_4_ = auVar140._8_4_ * auVar99._8_4_;
      auVar94._12_4_ = auVar140._12_4_ * auVar99._12_4_;
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar51 + 0x80 + uVar65),auVar80,
                                *(undefined1 (*) [16])(uVar51 + 0x20 + uVar65));
      auVar99 = vsubps_avx(auVar99,auVar134._0_16_);
      auVar102._0_4_ = auVar143._0_4_ * auVar99._0_4_;
      auVar102._4_4_ = auVar143._4_4_ * auVar99._4_4_;
      auVar102._8_4_ = auVar143._8_4_ * auVar99._8_4_;
      auVar102._12_4_ = auVar143._12_4_ * auVar99._12_4_;
      auVar99 = vmaxps_avx(auVar94,auVar102);
      local_1220 = vmaxps_avx(auVar81,auVar99);
      auVar81 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar51 + 0x80 + (uVar64 ^ 0x10)),auVar80,
                                *(undefined1 (*) [16])(uVar51 + 0x20 + (uVar64 ^ 0x10)));
      auVar81 = vsubps_avx(auVar81,auVar129._0_16_);
      auVar95._0_4_ = auVar87._0_4_ * auVar81._0_4_;
      auVar95._4_4_ = fVar145 * auVar81._4_4_;
      auVar95._8_4_ = fVar146 * auVar81._8_4_;
      auVar95._12_4_ = fVar107 * auVar81._12_4_;
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar51 + 0x80 + (uVar66 ^ 0x10)),auVar80,
                                *(undefined1 (*) [16])(uVar51 + 0x20 + (uVar66 ^ 0x10)));
      auVar81 = vminps_avx(auVar76._0_16_,auVar95);
      auVar99 = vsubps_avx(auVar99,auVar132._0_16_);
      auVar103._0_4_ = auVar148._0_4_ * auVar99._0_4_;
      auVar103._4_4_ = auVar148._4_4_ * auVar99._4_4_;
      auVar103._8_4_ = auVar148._8_4_ * auVar99._8_4_;
      auVar103._12_4_ = auVar148._12_4_ * auVar99._12_4_;
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar51 + 0x80 + (uVar65 ^ 0x10)),auVar80,
                                *(undefined1 (*) [16])(uVar51 + 0x20 + (uVar65 ^ 0x10)));
      auVar99 = vsubps_avx(auVar99,auVar134._0_16_);
      auVar108._0_4_ = auVar155._0_4_ * auVar99._0_4_;
      auVar108._4_4_ = auVar155._4_4_ * auVar99._4_4_;
      auVar108._8_4_ = auVar155._8_4_ * auVar99._8_4_;
      auVar108._12_4_ = auVar155._12_4_ * auVar99._12_4_;
      auVar99 = vminps_avx(auVar103,auVar108);
      auVar81 = vminps_avx(auVar81,auVar99);
      if (((uint)uVar61 & 7) == 6) {
        auVar99 = vcmpps_avx(local_1220,auVar81,2);
        auVar81 = vcmpps_avx(*(undefined1 (*) [16])(uVar51 + 0xe0),auVar80,2);
        auVar80 = vcmpps_avx(auVar80,*(undefined1 (*) [16])(uVar51 + 0xf0),1);
        auVar81 = vandps_avx(auVar81,auVar80);
        auVar81 = vandps_avx(auVar81,auVar99);
      }
      else {
        auVar81 = vcmpps_avx(local_1220,auVar81,2);
      }
      auVar81 = vpslld_avx(auVar81,0x1f);
      uVar52 = vmovmskps_avx(auVar81);
      if (uVar52 == 0) goto LAB_01499609;
      uVar52 = uVar52 & 0xff;
      lVar20 = 0;
      for (uVar61 = (ulong)uVar52; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar61 = *(ulong *)(uVar51 + lVar20 * 8);
      uVar52 = uVar52 - 1 & uVar52;
      uVar53 = (ulong)uVar52;
      if (uVar52 != 0) {
        uVar49 = *(uint *)(local_1220 + lVar20 * 4);
        lVar20 = 0;
        for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
          lVar20 = lVar20 + 1;
        }
        uVar52 = uVar52 - 1 & uVar52;
        uVar54 = (ulong)uVar52;
        uVar53 = *(ulong *)(uVar51 + lVar20 * 8);
        uVar2 = *(uint *)(local_1220 + lVar20 * 4);
        if (uVar52 == 0) {
          if (uVar49 < uVar2) {
            *(ulong *)*pauVar59 = uVar53;
            *(uint *)(*pauVar59 + 8) = uVar2;
            pauVar59 = pauVar59 + 1;
          }
          else {
            *(ulong *)*pauVar59 = uVar61;
            *(uint *)(*pauVar59 + 8) = uVar49;
            pauVar59 = pauVar59 + 1;
            uVar61 = uVar53;
          }
        }
        else {
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar61;
          auVar81 = vpunpcklqdq_avx(auVar82,ZEXT416(uVar49));
          auVar89._8_8_ = 0;
          auVar89._0_8_ = uVar53;
          auVar99 = vpunpcklqdq_avx(auVar89,ZEXT416(uVar2));
          lVar20 = 0;
          for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar52 = uVar52 - 1 & uVar52;
          uVar61 = (ulong)uVar52;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)(uVar51 + lVar20 * 8);
          auVar88 = vpunpcklqdq_avx(auVar96,ZEXT416(*(uint *)(local_1220 + lVar20 * 4)));
          auVar80 = vpcmpgtd_avx(auVar99,auVar81);
          if (uVar52 == 0) {
            auVar100 = vpshufd_avx(auVar80,0xaa);
            auVar80 = vblendvps_avx(auVar99,auVar81,auVar100);
            auVar81 = vblendvps_avx(auVar81,auVar99,auVar100);
            auVar99 = vpcmpgtd_avx(auVar88,auVar80);
            auVar100 = vpshufd_avx(auVar99,0xaa);
            auVar99 = vblendvps_avx(auVar88,auVar80,auVar100);
            auVar80 = vblendvps_avx(auVar80,auVar88,auVar100);
            auVar88 = vpcmpgtd_avx(auVar80,auVar81);
            auVar100 = vpshufd_avx(auVar88,0xaa);
            auVar88 = vblendvps_avx(auVar80,auVar81,auVar100);
            auVar81 = vblendvps_avx(auVar81,auVar80,auVar100);
            *pauVar59 = auVar81;
            pauVar59[1] = auVar88;
            uVar61 = auVar99._0_8_;
            pauVar59 = pauVar59 + 2;
          }
          else {
            lVar20 = 0;
            for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            auVar109._8_8_ = 0;
            auVar109._0_8_ = *(ulong *)(uVar51 + lVar20 * 8);
            auVar101 = vpunpcklqdq_avx(auVar109,ZEXT416(*(uint *)(local_1220 + lVar20 * 4)));
            auVar100 = vpshufd_avx(auVar80,0xaa);
            auVar80 = vblendvps_avx(auVar99,auVar81,auVar100);
            auVar81 = vblendvps_avx(auVar81,auVar99,auVar100);
            auVar99 = vpcmpgtd_avx(auVar101,auVar88);
            auVar100 = vpshufd_avx(auVar99,0xaa);
            auVar99 = vblendvps_avx(auVar101,auVar88,auVar100);
            auVar88 = vblendvps_avx(auVar88,auVar101,auVar100);
            auVar100 = vpcmpgtd_avx(auVar88,auVar81);
            auVar101 = vpshufd_avx(auVar100,0xaa);
            auVar100 = vblendvps_avx(auVar88,auVar81,auVar101);
            auVar81 = vblendvps_avx(auVar81,auVar88,auVar101);
            auVar88 = vpcmpgtd_avx(auVar99,auVar80);
            auVar101 = vpshufd_avx(auVar88,0xaa);
            auVar88 = vblendvps_avx(auVar99,auVar80,auVar101);
            auVar99 = vblendvps_avx(auVar80,auVar99,auVar101);
            auVar80 = vpcmpgtd_avx(auVar100,auVar99);
            auVar101 = vpshufd_avx(auVar80,0xaa);
            auVar80 = vblendvps_avx(auVar100,auVar99,auVar101);
            auVar99 = vblendvps_avx(auVar99,auVar100,auVar101);
            *pauVar59 = auVar81;
            pauVar59[1] = auVar99;
            pauVar59[2] = auVar80;
            auVar125 = ZEXT1664(local_1350);
            uVar61 = auVar88._0_8_;
            pauVar59 = pauVar59 + 3;
          }
        }
      }
    }
    if (((uint)uVar61 & 0xf) == 8) {
      uVar52 = *(uint *)(local_14a8 + 0xc);
      local_1330 = (ulong)uVar52;
      uVar49 = *(uint *)(local_14a8 + 0x10);
      lVar57 = (ulong)*(uint *)(local_14a8 + 0x28) * local_1458 +
               (ulong)*(uint *)(local_14a8 + 0x24) + local_1460;
      uVar61 = uVar61 >> 4;
      lVar20 = lVar57 + uVar61 * 4;
      lVar60 = lVar57 + uVar61 * 4 + -4;
      auVar81 = *(undefined1 (*) [16])(lVar20 + -4 + local_1330 * 4);
      auVar99 = auVar81;
      if (2 < (ulong)uVar49) {
        auVar99 = *(undefined1 (*) [16])(lVar60 + local_1330 * 8);
      }
      auVar80 = *(undefined1 (*) [16])(lVar57 + -4 + uVar61 * 4);
      if (uVar52 == 2) {
        auVar80 = vshufps_avx(auVar80,auVar80,0x54);
        auVar81 = vshufps_avx(auVar81,auVar81,0x54);
        auVar99 = vshufps_avx(auVar99,auVar99,0x54);
      }
      uVar61 = CONCAT44(0,*(uint *)(local_14a8 + 0x14));
      pauVar58 = (undefined1 (*) [16])(lVar20 + uVar61 * 4 + -4);
      auVar88 = *(undefined1 (*) [16])(*pauVar58 + local_1330 * 4);
      auVar87 = auVar88;
      if (2 < uVar49) {
        auVar87 = *(undefined1 (*) [16])(*pauVar58 + local_1330 * 8);
      }
      auVar93 = *pauVar58;
      if (uVar52 == 2) {
        auVar93 = vshufps_avx(auVar93,auVar93,0x54);
        auVar88 = vshufps_avx(auVar88,auVar88,0x54);
        auVar87 = vshufps_avx(auVar87,auVar87,0x54);
      }
      pauVar62 = (undefined1 (*) [16])(lVar20 + uVar61 * 8 + -4);
      auVar100 = *(undefined1 (*) [16])(*pauVar62 + local_1330 * 4);
      auVar101 = auVar100;
      if (2 < uVar49) {
        auVar101 = *(undefined1 (*) [16])(*pauVar62 + local_1330 * 8);
      }
      auVar94 = *pauVar62;
      if (uVar52 == 2) {
        auVar94 = vshufps_avx(auVar94,auVar94,0x54);
        auVar100 = vshufps_avx(auVar100,auVar100,0x54);
        auVar101 = vshufps_avx(auVar101,auVar101,0x54);
      }
      uVar51 = (ulong)(*(uint *)(local_14a8 + 0x28) & 0xfffffffc);
      auVar95 = *(undefined1 (*) [16])(lVar60 + uVar51 + local_1330 * 4);
      auVar102 = auVar95;
      if (2 < uVar49) {
        auVar102 = *(undefined1 (*) [16])(lVar60 + uVar51 + local_1330 * 8);
      }
      local_13a0._0_8_ = uVar61;
      _local_14a0 = *(undefined1 (*) [16])(lVar60 + uVar51);
      if (uVar52 == 2) {
        _local_14a0 = vshufps_avx(_local_14a0,_local_14a0,0x54);
        auVar95 = vshufps_avx(auVar95,auVar95,0x54);
        auVar102 = vshufps_avx(auVar102,auVar102,0x54);
      }
      pauVar58 = (undefined1 (*) [16])(*pauVar58 + uVar51);
      auVar103 = *(undefined1 (*) [16])(*pauVar58 + local_1330 * 4);
      auVar108 = auVar103;
      if (2 < uVar49) {
        auVar108 = *(undefined1 (*) [16])(*pauVar58 + local_1330 * 8);
      }
      local_1400._0_16_ = *pauVar58;
      if (uVar52 == 2) {
        local_1400._0_16_ = vshufps_avx(local_1400._0_16_,local_1400._0_16_,0x54);
        auVar103 = vshufps_avx(auVar103,auVar103,0x54);
        auVar108 = vshufps_avx(auVar108,auVar108,0x54);
      }
      pauVar58 = (undefined1 (*) [16])(*pauVar62 + uVar51);
      auVar96 = *pauVar58;
      auVar82 = *(undefined1 (*) [16])(*pauVar58 + local_1330 * 4);
      auVar89 = auVar82;
      if (2 < uVar49) {
        auVar89 = *(undefined1 (*) [16])(*pauVar58 + local_1330 * 8);
      }
      auVar72._16_16_ = auVar81;
      auVar72._0_16_ = auVar80;
      auVar68._16_16_ = auVar99;
      auVar68._0_16_ = auVar81;
      auVar15 = vunpcklps_avx(auVar72,auVar68);
      auVar72 = vshufps_avx(auVar72,auVar72,0xa5);
      auVar68 = vshufps_avx(auVar68,auVar68,0x94);
      auVar110._16_16_ = auVar88;
      auVar110._0_16_ = auVar93;
      auVar113._16_16_ = auVar87;
      auVar113._0_16_ = auVar88;
      auVar16 = vunpcklps_avx(auVar110,auVar113);
      auVar110 = vshufps_avx(auVar110,auVar110,0xa5);
      auVar113 = vshufps_avx(auVar113,auVar113,0x94);
      auVar124._16_16_ = auVar100;
      auVar124._0_16_ = auVar94;
      auVar121._16_16_ = auVar101;
      auVar121._0_16_ = auVar100;
      auVar17 = vunpcklps_avx(auVar124,auVar121);
      auVar124 = vshufps_avx(auVar124,auVar124,0xa5);
      auVar121 = vshufps_avx(auVar121,auVar121,0x94);
      auVar127._16_16_ = auVar95;
      auVar127._0_16_ = _local_14a0;
      auVar135._16_16_ = auVar102;
      auVar135._0_16_ = auVar95;
      auVar18 = vunpcklps_avx(auVar127,auVar135);
      auVar127 = vshufps_avx(auVar127,auVar127,0xa5);
      auVar135 = vshufps_avx(auVar135,auVar135,0x94);
      auVar131._16_16_ = auVar103;
      auVar131._0_16_ = local_1400._0_16_;
      auVar122._16_16_ = auVar108;
      auVar122._0_16_ = auVar103;
      auVar19 = vunpcklps_avx(auVar131,auVar122);
      auVar131 = vshufps_avx(auVar131,auVar131,0xa5);
      auVar122 = vshufps_avx(auVar122,auVar122,0x94);
      if (uVar52 == 2) {
        auVar96 = vshufps_avx(auVar96,auVar96,0x54);
        auVar82 = vshufps_avx(auVar82,auVar82,0x54);
        auVar89 = vshufps_avx(auVar89,auVar89,0x54);
      }
      auVar123._16_16_ = auVar82;
      auVar123._0_16_ = auVar96;
      auVar141._16_16_ = auVar89;
      auVar141._0_16_ = auVar82;
      auVar21._4_4_ = fStack_109c * auVar18._4_4_;
      auVar21._0_4_ = local_10a0 * auVar18._0_4_;
      auVar21._8_4_ = fStack_1098 * auVar18._8_4_;
      auVar21._12_4_ = fStack_1094 * auVar18._12_4_;
      auVar21._16_4_ = fStack_1090 * auVar18._16_4_;
      auVar21._20_4_ = fStack_108c * auVar18._20_4_;
      auVar21._24_4_ = fStack_1088 * auVar18._24_4_;
      auVar21._28_4_ = auVar18._28_4_;
      auVar48._4_4_ = fStack_10bc;
      auVar48._0_4_ = local_10c0;
      auVar48._8_4_ = fStack_10b8;
      auVar48._12_4_ = fStack_10b4;
      auVar48._16_4_ = fStack_10b0;
      auVar48._20_4_ = fStack_10ac;
      auVar48._24_4_ = fStack_10a8;
      auVar48._28_4_ = fStack_10a4;
      auVar81 = vfmadd213ps_fma(auVar15,auVar48,auVar21);
      auVar22._4_4_ = fStack_109c * auVar19._4_4_;
      auVar22._0_4_ = local_10a0 * auVar19._0_4_;
      auVar22._8_4_ = fStack_1098 * auVar19._8_4_;
      auVar22._12_4_ = fStack_1094 * auVar19._12_4_;
      auVar22._16_4_ = fStack_1090 * auVar19._16_4_;
      auVar22._20_4_ = fStack_108c * auVar19._20_4_;
      auVar22._24_4_ = fStack_1088 * auVar19._24_4_;
      auVar22._28_4_ = auVar18._28_4_;
      auVar99 = vfmadd213ps_fma(auVar16,auVar48,auVar22);
      auVar18 = vunpcklps_avx(auVar123,auVar141);
      auVar15 = vshufps_avx(auVar123,auVar123,0xa5);
      auVar16 = vshufps_avx(auVar141,auVar141,0x94);
      auVar19._4_4_ = fStack_109c * auVar18._4_4_;
      auVar19._0_4_ = local_10a0 * auVar18._0_4_;
      auVar19._8_4_ = fStack_1098 * auVar18._8_4_;
      auVar19._12_4_ = fStack_1094 * auVar18._12_4_;
      auVar19._16_4_ = fStack_1090 * auVar18._16_4_;
      auVar19._20_4_ = fStack_108c * auVar18._20_4_;
      uVar67 = auVar18._28_4_;
      auVar19._24_4_ = fStack_1088 * auVar18._24_4_;
      auVar19._28_4_ = uVar67;
      auVar80 = vfmadd213ps_fma(auVar17,auVar48,auVar19);
      local_1420._0_4_ = auVar127._0_4_;
      local_1420._4_4_ = auVar127._4_4_;
      auStack_1418._0_4_ = auVar127._8_4_;
      auStack_1418._4_4_ = auVar127._12_4_;
      fStack_1410 = auVar127._16_4_;
      fStack_140c = auVar127._20_4_;
      fStack_1408 = auVar127._24_4_;
      auVar17._4_4_ = fStack_109c * (float)local_1420._4_4_;
      auVar17._0_4_ = local_10a0 * (float)local_1420._0_4_;
      auVar17._8_4_ = fStack_1098 * (float)auStack_1418._0_4_;
      auVar17._12_4_ = fStack_1094 * (float)auStack_1418._4_4_;
      auVar17._16_4_ = fStack_1090 * fStack_1410;
      auVar17._20_4_ = fStack_108c * fStack_140c;
      auVar17._24_4_ = fStack_1088 * fStack_1408;
      auVar17._28_4_ = uVar67;
      auVar18._4_4_ = fStack_109c * auVar131._4_4_;
      auVar18._0_4_ = local_10a0 * auVar131._0_4_;
      auVar18._8_4_ = fStack_1098 * auVar131._8_4_;
      auVar18._12_4_ = fStack_1094 * auVar131._12_4_;
      auVar18._16_4_ = fStack_1090 * auVar131._16_4_;
      auVar18._20_4_ = fStack_108c * auVar131._20_4_;
      auVar18._24_4_ = fStack_1088 * auVar131._24_4_;
      auVar18._28_4_ = auVar131._28_4_;
      auVar23._4_4_ = fStack_109c * auVar15._4_4_;
      auVar23._0_4_ = local_10a0 * auVar15._0_4_;
      auVar23._8_4_ = fStack_1098 * auVar15._8_4_;
      auVar23._12_4_ = fStack_1094 * auVar15._12_4_;
      auVar23._16_4_ = fStack_1090 * auVar15._16_4_;
      auVar23._20_4_ = fStack_108c * auVar15._20_4_;
      auVar23._24_4_ = fStack_1088 * auVar15._24_4_;
      auVar23._28_4_ = auVar15._28_4_;
      auVar88 = vfmadd213ps_fma(auVar72,auVar48,auVar17);
      auVar87 = vfmadd213ps_fma(auVar110,auVar48,auVar18);
      auVar93 = vfmadd213ps_fma(auVar124,auVar48,auVar23);
      auVar24._4_4_ = fStack_109c * auVar135._4_4_;
      auVar24._0_4_ = local_10a0 * auVar135._0_4_;
      auVar24._8_4_ = fStack_1098 * auVar135._8_4_;
      auVar24._12_4_ = fStack_1094 * auVar135._12_4_;
      auVar24._16_4_ = fStack_1090 * auVar135._16_4_;
      auVar24._20_4_ = fStack_108c * auVar135._20_4_;
      auVar24._24_4_ = fStack_1088 * auVar135._24_4_;
      auVar24._28_4_ = auVar15._28_4_;
      local_14a0._0_4_ = auVar122._0_4_;
      local_14a0._4_4_ = auVar122._4_4_;
      fStack_1498 = auVar122._8_4_;
      fStack_1494 = auVar122._12_4_;
      fStack_1490 = auVar122._16_4_;
      fStack_148c = auVar122._20_4_;
      fStack_1488 = auVar122._24_4_;
      auVar25._4_4_ = fStack_109c * (float)local_14a0._4_4_;
      auVar25._0_4_ = local_10a0 * (float)local_14a0._0_4_;
      auVar25._8_4_ = fStack_1098 * fStack_1498;
      auVar25._12_4_ = fStack_1094 * fStack_1494;
      auVar25._16_4_ = fStack_1090 * fStack_1490;
      auVar25._20_4_ = fStack_108c * fStack_148c;
      auVar25._24_4_ = fStack_1088 * fStack_1488;
      auVar25._28_4_ = auVar131._28_4_;
      auVar26._4_4_ = fStack_109c * auVar16._4_4_;
      auVar26._0_4_ = local_10a0 * auVar16._0_4_;
      auVar26._8_4_ = fStack_1098 * auVar16._8_4_;
      auVar26._12_4_ = fStack_1094 * auVar16._12_4_;
      auVar26._16_4_ = fStack_1090 * auVar16._16_4_;
      auVar26._20_4_ = fStack_108c * auVar16._20_4_;
      auVar26._24_4_ = fStack_1088 * auVar16._24_4_;
      auVar26._28_4_ = uVar67;
      auVar100 = vfmadd213ps_fma(auVar68,auVar48,auVar24);
      auVar101 = vfmadd213ps_fma(auVar113,auVar48,auVar25);
      auVar94 = vfmadd213ps_fma(auVar121,auVar48,auVar26);
      uVar67 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      auVar133._4_4_ = uVar67;
      auVar133._0_4_ = uVar67;
      auVar133._8_4_ = uVar67;
      auVar133._12_4_ = uVar67;
      auVar133._16_4_ = uVar67;
      auVar133._20_4_ = uVar67;
      auVar133._24_4_ = uVar67;
      auVar133._28_4_ = uVar67;
      uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      auVar142._4_4_ = uVar67;
      auVar142._0_4_ = uVar67;
      auVar142._8_4_ = uVar67;
      auVar142._12_4_ = uVar67;
      auVar142._16_4_ = uVar67;
      auVar142._20_4_ = uVar67;
      auVar142._24_4_ = uVar67;
      auVar142._28_4_ = uVar67;
      uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      auVar144._4_4_ = uVar67;
      auVar144._0_4_ = uVar67;
      auVar144._8_4_ = uVar67;
      auVar144._12_4_ = uVar67;
      auVar144._16_4_ = uVar67;
      auVar144._20_4_ = uVar67;
      auVar144._24_4_ = uVar67;
      auVar144._28_4_ = uVar67;
      _local_14a0 = vsubps_avx(ZEXT1632(auVar81),auVar133);
      local_13e0 = vsubps_avx(ZEXT1632(auVar99),auVar142);
      local_1400 = vsubps_avx(ZEXT1632(auVar80),auVar144);
      auVar72 = vsubps_avx(ZEXT1632(auVar88),auVar133);
      auVar68 = vsubps_avx(ZEXT1632(auVar87),auVar142);
      auVar110 = vsubps_avx(ZEXT1632(auVar93),auVar144);
      auVar113 = vsubps_avx(ZEXT1632(auVar100),auVar133);
      auVar124 = vsubps_avx(ZEXT1632(auVar101),auVar142);
      auVar121 = vsubps_avx(ZEXT1632(auVar94),auVar144);
      _local_1420 = vsubps_avx(auVar113,_local_14a0);
      local_fc0 = vsubps_avx(auVar124,local_13e0);
      local_1320 = vsubps_avx(auVar121,local_1400);
      auVar69._0_4_ = local_14a0._0_4_ + auVar113._0_4_;
      auVar69._4_4_ = local_14a0._4_4_ + auVar113._4_4_;
      auVar69._8_4_ = local_14a0._8_4_ + auVar113._8_4_;
      auVar69._12_4_ = local_14a0._12_4_ + auVar113._12_4_;
      auVar69._16_4_ = local_14a0._16_4_ + auVar113._16_4_;
      auVar69._20_4_ = local_14a0._20_4_ + auVar113._20_4_;
      auVar69._24_4_ = local_14a0._24_4_ + auVar113._24_4_;
      auVar69._28_4_ = local_14a0._28_4_ + auVar113._28_4_;
      auVar83._0_4_ = local_13e0._0_4_ + auVar124._0_4_;
      auVar83._4_4_ = local_13e0._4_4_ + auVar124._4_4_;
      auVar83._8_4_ = local_13e0._8_4_ + auVar124._8_4_;
      auVar83._12_4_ = local_13e0._12_4_ + auVar124._12_4_;
      auVar83._16_4_ = local_13e0._16_4_ + auVar124._16_4_;
      auVar83._20_4_ = local_13e0._20_4_ + auVar124._20_4_;
      auVar83._24_4_ = local_13e0._24_4_ + auVar124._24_4_;
      fVar107 = auVar124._28_4_;
      auVar83._28_4_ = local_13e0._28_4_ + fVar107;
      auVar93._0_4_ = local_1400._0_4_;
      auVar104._0_4_ = auVar121._0_4_ + auVar93._0_4_;
      fVar136 = local_1400._4_4_;
      auVar104._4_4_ = auVar121._4_4_ + fVar136;
      fVar137 = local_1400._8_4_;
      auVar104._8_4_ = auVar121._8_4_ + fVar137;
      fVar138 = local_1400._12_4_;
      auVar104._12_4_ = auVar121._12_4_ + fVar138;
      auVar87._0_4_ = local_1400._16_4_;
      auVar104._16_4_ = auVar121._16_4_ + auVar87._0_4_;
      fVar145 = local_1400._20_4_;
      auVar104._20_4_ = auVar121._20_4_ + fVar145;
      fVar146 = local_1400._24_4_;
      auVar104._24_4_ = auVar121._24_4_ + fVar146;
      fVar77 = local_1400._28_4_;
      auVar104._28_4_ = auVar121._28_4_ + fVar77;
      auVar16._4_4_ = local_1320._4_4_ * auVar83._4_4_;
      auVar16._0_4_ = local_1320._0_4_ * auVar83._0_4_;
      auVar16._8_4_ = local_1320._8_4_ * auVar83._8_4_;
      auVar16._12_4_ = local_1320._12_4_ * auVar83._12_4_;
      auVar16._16_4_ = local_1320._16_4_ * auVar83._16_4_;
      auVar16._20_4_ = local_1320._20_4_ * auVar83._20_4_;
      auVar16._24_4_ = local_1320._24_4_ * auVar83._24_4_;
      auVar16._28_4_ = uVar67;
      auVar99 = vfmsub231ps_fma(auVar16,local_fc0,auVar104);
      auVar27._4_4_ = local_1420._4_4_ * auVar104._4_4_;
      auVar27._0_4_ = local_1420._0_4_ * auVar104._0_4_;
      auVar27._8_4_ = local_1420._8_4_ * auVar104._8_4_;
      auVar27._12_4_ = local_1420._12_4_ * auVar104._12_4_;
      auVar27._16_4_ = local_1420._16_4_ * auVar104._16_4_;
      auVar27._20_4_ = local_1420._20_4_ * auVar104._20_4_;
      auVar27._24_4_ = local_1420._24_4_ * auVar104._24_4_;
      auVar27._28_4_ = auVar104._28_4_;
      auVar81 = vfmsub231ps_fma(auVar27,local_1320,auVar69);
      auVar28._4_4_ = local_fc0._4_4_ * auVar69._4_4_;
      auVar28._0_4_ = local_fc0._0_4_ * auVar69._0_4_;
      auVar28._8_4_ = local_fc0._8_4_ * auVar69._8_4_;
      auVar28._12_4_ = local_fc0._12_4_ * auVar69._12_4_;
      auVar28._16_4_ = local_fc0._16_4_ * auVar69._16_4_;
      auVar28._20_4_ = local_fc0._20_4_ * auVar69._20_4_;
      auVar28._24_4_ = local_fc0._24_4_ * auVar69._24_4_;
      auVar28._28_4_ = auVar69._28_4_;
      local_fe0 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar80 = vfmsub231ps_fma(auVar28,_local_1420,auVar83);
      auVar29._4_4_ = local_fe0 * auVar80._4_4_;
      auVar29._0_4_ = local_fe0 * auVar80._0_4_;
      auVar29._8_4_ = local_fe0 * auVar80._8_4_;
      auVar29._12_4_ = local_fe0 * auVar80._12_4_;
      auVar29._16_4_ = local_fe0 * 0.0;
      auVar29._20_4_ = local_fe0 * 0.0;
      auVar29._24_4_ = local_fe0 * 0.0;
      auVar29._28_4_ = local_1420._28_4_;
      uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      local_13c0._4_4_ = uVar67;
      local_13c0._0_4_ = uVar67;
      local_13c0._8_4_ = uVar67;
      local_13c0._12_4_ = uVar67;
      local_13c0._16_4_ = uVar67;
      local_13c0._20_4_ = uVar67;
      local_13c0._24_4_ = uVar67;
      local_13c0._28_4_ = uVar67;
      auVar81 = vfmadd231ps_fma(auVar29,local_13c0,ZEXT1632(auVar81));
      uVar67 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      local_1000._4_4_ = uVar67;
      local_1000._0_4_ = uVar67;
      local_1000._8_4_ = uVar67;
      local_1000._12_4_ = uVar67;
      local_1000._16_4_ = uVar67;
      local_1000._20_4_ = uVar67;
      local_1000._24_4_ = uVar67;
      local_1000._28_4_ = uVar67;
      local_1220 = vfmadd231ps_fma(ZEXT1632(auVar81),local_1000,ZEXT1632(auVar99));
      local_1020 = vsubps_avx(local_13e0,auVar68);
      local_1040 = vsubps_avx(local_1400,auVar110);
      auVar84._0_4_ = local_13e0._0_4_ + auVar68._0_4_;
      auVar84._4_4_ = local_13e0._4_4_ + auVar68._4_4_;
      auVar84._8_4_ = local_13e0._8_4_ + auVar68._8_4_;
      auVar84._12_4_ = local_13e0._12_4_ + auVar68._12_4_;
      auVar84._16_4_ = local_13e0._16_4_ + auVar68._16_4_;
      auVar84._20_4_ = local_13e0._20_4_ + auVar68._20_4_;
      auVar84._24_4_ = local_13e0._24_4_ + auVar68._24_4_;
      auVar84._28_4_ = local_13e0._28_4_ + auVar68._28_4_;
      auVar105._0_4_ = auVar93._0_4_ + auVar110._0_4_;
      auVar105._4_4_ = fVar136 + auVar110._4_4_;
      auVar105._8_4_ = fVar137 + auVar110._8_4_;
      auVar105._12_4_ = fVar138 + auVar110._12_4_;
      auVar105._16_4_ = auVar87._0_4_ + auVar110._16_4_;
      auVar105._20_4_ = fVar145 + auVar110._20_4_;
      auVar105._24_4_ = fVar146 + auVar110._24_4_;
      auVar105._28_4_ = fVar77 + auVar110._28_4_;
      fVar78 = local_1040._0_4_;
      fVar79 = local_1040._4_4_;
      auVar30._4_4_ = auVar84._4_4_ * fVar79;
      auVar30._0_4_ = auVar84._0_4_ * fVar78;
      fVar5 = local_1040._8_4_;
      auVar30._8_4_ = auVar84._8_4_ * fVar5;
      fVar7 = local_1040._12_4_;
      auVar30._12_4_ = auVar84._12_4_ * fVar7;
      fVar9 = local_1040._16_4_;
      auVar30._16_4_ = auVar84._16_4_ * fVar9;
      fVar11 = local_1040._20_4_;
      auVar30._20_4_ = auVar84._20_4_ * fVar11;
      fVar13 = local_1040._24_4_;
      auVar30._24_4_ = auVar84._24_4_ * fVar13;
      auVar30._28_4_ = fVar77;
      auVar99 = vfmsub231ps_fma(auVar30,local_1020,auVar105);
      auVar127 = vsubps_avx(_local_14a0,auVar72);
      fVar147 = auVar127._0_4_;
      fVar149 = auVar127._4_4_;
      auVar31._4_4_ = fVar149 * auVar105._4_4_;
      auVar31._0_4_ = fVar147 * auVar105._0_4_;
      fVar150 = auVar127._8_4_;
      auVar31._8_4_ = fVar150 * auVar105._8_4_;
      fVar151 = auVar127._12_4_;
      auVar31._12_4_ = fVar151 * auVar105._12_4_;
      fVar152 = auVar127._16_4_;
      auVar31._16_4_ = fVar152 * auVar105._16_4_;
      fVar153 = auVar127._20_4_;
      auVar31._20_4_ = fVar153 * auVar105._20_4_;
      fVar154 = auVar127._24_4_;
      auVar31._24_4_ = fVar154 * auVar105._24_4_;
      auVar31._28_4_ = auVar105._28_4_;
      auVar139._0_4_ = local_14a0._0_4_ + auVar72._0_4_;
      auVar139._4_4_ = local_14a0._4_4_ + auVar72._4_4_;
      auVar139._8_4_ = local_14a0._8_4_ + auVar72._8_4_;
      auVar139._12_4_ = local_14a0._12_4_ + auVar72._12_4_;
      auVar139._16_4_ = local_14a0._16_4_ + auVar72._16_4_;
      auVar139._20_4_ = local_14a0._20_4_ + auVar72._20_4_;
      auVar139._24_4_ = local_14a0._24_4_ + auVar72._24_4_;
      auVar139._28_4_ = local_14a0._28_4_ + auVar72._28_4_;
      auVar81 = vfmsub231ps_fma(auVar31,local_1040,auVar139);
      fVar77 = local_1020._0_4_;
      fVar4 = local_1020._4_4_;
      auVar32._4_4_ = auVar139._4_4_ * fVar4;
      auVar32._0_4_ = auVar139._0_4_ * fVar77;
      fVar6 = local_1020._8_4_;
      auVar32._8_4_ = auVar139._8_4_ * fVar6;
      fVar8 = local_1020._12_4_;
      auVar32._12_4_ = auVar139._12_4_ * fVar8;
      fVar10 = local_1020._16_4_;
      auVar32._16_4_ = auVar139._16_4_ * fVar10;
      fVar12 = local_1020._20_4_;
      auVar32._20_4_ = auVar139._20_4_ * fVar12;
      fVar14 = local_1020._24_4_;
      auVar32._24_4_ = auVar139._24_4_ * fVar14;
      auVar32._28_4_ = local_1040._28_4_;
      auVar80 = vfmsub231ps_fma(auVar32,auVar127,auVar84);
      auVar33._4_4_ = local_fe0 * auVar80._4_4_;
      auVar33._0_4_ = local_fe0 * auVar80._0_4_;
      auVar33._8_4_ = local_fe0 * auVar80._8_4_;
      auVar33._12_4_ = local_fe0 * auVar80._12_4_;
      auVar33._16_4_ = local_fe0 * 0.0;
      auVar33._20_4_ = local_fe0 * 0.0;
      auVar33._24_4_ = local_fe0 * 0.0;
      auVar33._28_4_ = auVar84._28_4_;
      auVar81 = vfmadd231ps_fma(auVar33,local_13c0,ZEXT1632(auVar81));
      auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_1000,ZEXT1632(auVar99));
      auVar135 = vsubps_avx(auVar72,auVar113);
      auVar70._0_4_ = auVar72._0_4_ + auVar113._0_4_;
      auVar70._4_4_ = auVar72._4_4_ + auVar113._4_4_;
      auVar70._8_4_ = auVar72._8_4_ + auVar113._8_4_;
      auVar70._12_4_ = auVar72._12_4_ + auVar113._12_4_;
      auVar70._16_4_ = auVar72._16_4_ + auVar113._16_4_;
      auVar70._20_4_ = auVar72._20_4_ + auVar113._20_4_;
      auVar70._24_4_ = auVar72._24_4_ + auVar113._24_4_;
      auVar70._28_4_ = auVar72._28_4_ + auVar113._28_4_;
      auVar113 = vsubps_avx(auVar68,auVar124);
      auVar97._0_4_ = auVar68._0_4_ + auVar124._0_4_;
      auVar97._4_4_ = auVar68._4_4_ + auVar124._4_4_;
      auVar97._8_4_ = auVar68._8_4_ + auVar124._8_4_;
      auVar97._12_4_ = auVar68._12_4_ + auVar124._12_4_;
      auVar97._16_4_ = auVar68._16_4_ + auVar124._16_4_;
      auVar97._20_4_ = auVar68._20_4_ + auVar124._20_4_;
      auVar97._24_4_ = auVar68._24_4_ + auVar124._24_4_;
      auVar97._28_4_ = auVar68._28_4_ + fVar107;
      auVar124 = vsubps_avx(auVar110,auVar121);
      auVar90._0_4_ = auVar110._0_4_ + auVar121._0_4_;
      auVar90._4_4_ = auVar110._4_4_ + auVar121._4_4_;
      auVar90._8_4_ = auVar110._8_4_ + auVar121._8_4_;
      auVar90._12_4_ = auVar110._12_4_ + auVar121._12_4_;
      auVar90._16_4_ = auVar110._16_4_ + auVar121._16_4_;
      auVar90._20_4_ = auVar110._20_4_ + auVar121._20_4_;
      auVar90._24_4_ = auVar110._24_4_ + auVar121._24_4_;
      auVar90._28_4_ = auVar110._28_4_ + auVar121._28_4_;
      auVar34._4_4_ = auVar124._4_4_ * auVar97._4_4_;
      auVar34._0_4_ = auVar124._0_4_ * auVar97._0_4_;
      auVar34._8_4_ = auVar124._8_4_ * auVar97._8_4_;
      auVar34._12_4_ = auVar124._12_4_ * auVar97._12_4_;
      auVar34._16_4_ = auVar124._16_4_ * auVar97._16_4_;
      auVar34._20_4_ = auVar124._20_4_ * auVar97._20_4_;
      auVar34._24_4_ = auVar124._24_4_ * auVar97._24_4_;
      auVar34._28_4_ = fVar107;
      auVar80 = vfmsub231ps_fma(auVar34,auVar113,auVar90);
      auVar35._4_4_ = auVar90._4_4_ * auVar135._4_4_;
      auVar35._0_4_ = auVar90._0_4_ * auVar135._0_4_;
      auVar35._8_4_ = auVar90._8_4_ * auVar135._8_4_;
      auVar35._12_4_ = auVar90._12_4_ * auVar135._12_4_;
      auVar35._16_4_ = auVar90._16_4_ * auVar135._16_4_;
      auVar35._20_4_ = auVar90._20_4_ * auVar135._20_4_;
      auVar35._24_4_ = auVar90._24_4_ * auVar135._24_4_;
      auVar35._28_4_ = auVar90._28_4_;
      auVar99 = vfmsub231ps_fma(auVar35,auVar124,auVar70);
      auVar36._4_4_ = auVar113._4_4_ * auVar70._4_4_;
      auVar36._0_4_ = auVar113._0_4_ * auVar70._0_4_;
      auVar36._8_4_ = auVar113._8_4_ * auVar70._8_4_;
      auVar36._12_4_ = auVar113._12_4_ * auVar70._12_4_;
      auVar36._16_4_ = auVar113._16_4_ * auVar70._16_4_;
      auVar36._20_4_ = auVar113._20_4_ * auVar70._20_4_;
      auVar36._24_4_ = auVar113._24_4_ * auVar70._24_4_;
      auVar36._28_4_ = auVar70._28_4_;
      auVar88 = vfmsub231ps_fma(auVar36,auVar135,auVar97);
      fStack_fdc = local_fe0;
      fStack_fd8 = local_fe0;
      fStack_fd4 = local_fe0;
      fStack_fd0 = local_fe0;
      fStack_fcc = local_fe0;
      fStack_fc8 = local_fe0;
      fStack_fc4 = local_fe0;
      auVar71._0_4_ = local_fe0 * auVar88._0_4_;
      auVar71._4_4_ = local_fe0 * auVar88._4_4_;
      auVar71._8_4_ = local_fe0 * auVar88._8_4_;
      auVar71._12_4_ = local_fe0 * auVar88._12_4_;
      auVar71._16_4_ = local_fe0 * 0.0;
      auVar71._20_4_ = local_fe0 * 0.0;
      auVar71._24_4_ = local_fe0 * 0.0;
      auVar71._28_4_ = 0;
      auVar99 = vfmadd231ps_fma(auVar71,local_13c0,ZEXT1632(auVar99));
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_1000,ZEXT1632(auVar80));
      local_11e0 = ZEXT1632(CONCAT412(auVar99._12_4_ + local_1220._12_4_ + auVar81._12_4_,
                                      CONCAT48(auVar99._8_4_ + local_1220._8_4_ + auVar81._8_4_,
                                               CONCAT44(auVar99._4_4_ +
                                                        local_1220._4_4_ + auVar81._4_4_,
                                                        auVar99._0_4_ +
                                                        local_1220._0_4_ + auVar81._0_4_))));
      local_1480 = ZEXT1632(local_1220);
      auVar72 = vminps_avx(local_1480,ZEXT1632(auVar81));
      auVar72 = vminps_avx(auVar72,ZEXT1632(auVar99));
      auVar91._8_4_ = 0x7fffffff;
      auVar91._0_8_ = 0x7fffffff7fffffff;
      auVar91._12_4_ = 0x7fffffff;
      auVar91._16_4_ = 0x7fffffff;
      auVar91._20_4_ = 0x7fffffff;
      auVar91._24_4_ = 0x7fffffff;
      auVar91._28_4_ = 0x7fffffff;
      local_1080 = vandps_avx(local_11e0,auVar91);
      fVar107 = local_1080._0_4_ * 1.1920929e-07;
      fVar115 = local_1080._4_4_ * 1.1920929e-07;
      auVar37._4_4_ = fVar115;
      auVar37._0_4_ = fVar107;
      fVar116 = local_1080._8_4_ * 1.1920929e-07;
      auVar37._8_4_ = fVar116;
      fVar117 = local_1080._12_4_ * 1.1920929e-07;
      auVar37._12_4_ = fVar117;
      fVar118 = local_1080._16_4_ * 1.1920929e-07;
      auVar37._16_4_ = fVar118;
      fVar119 = local_1080._20_4_ * 1.1920929e-07;
      auVar37._20_4_ = fVar119;
      fVar120 = local_1080._24_4_ * 1.1920929e-07;
      auVar37._24_4_ = fVar120;
      auVar37._28_4_ = 0x34000000;
      auVar126._0_8_ = CONCAT44(fVar115,fVar107) ^ 0x8000000080000000;
      auVar126._8_4_ = -fVar116;
      auVar126._12_4_ = -fVar117;
      auVar126._16_4_ = -fVar118;
      auVar126._20_4_ = -fVar119;
      auVar126._24_4_ = -fVar120;
      auVar126._28_4_ = 0xb4000000;
      auVar72 = vcmpps_avx(auVar72,auVar126,5);
      auVar110 = vmaxps_avx(local_1480,ZEXT1632(auVar81));
      auVar68 = vmaxps_avx(auVar110,ZEXT1632(auVar99));
      auVar68 = vcmpps_avx(auVar68,auVar37,2);
      auVar68 = vorps_avx(auVar72,auVar68);
      local_1338 = (undefined1 (*) [16])(lVar20 + uVar61 * 0xc + -4);
      local_1328 = (ulong)uVar49;
      auVar15._4_4_ = uStack_123c;
      auVar15._0_4_ = local_1240;
      auVar15._8_4_ = uStack_1238;
      auVar15._12_4_ = uStack_1234;
      auVar15._16_4_ = uStack_1230;
      auVar15._20_4_ = uStack_122c;
      auVar15._24_4_ = uStack_1228;
      auVar15._28_4_ = uStack_1224;
      auVar15 = auVar15 & auVar68;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        local_1060 = 0x80000000;
        uStack_105c = 0x80000000;
        uStack_1058 = 0x80000000;
        uStack_1054 = 0x80000000;
        uStack_1050 = 0x80000000;
        uStack_104c = 0x80000000;
        uStack_1048 = 0x80000000;
        uStack_1044 = 0x80000000;
        local_13a0 = auVar68;
        auVar38._4_4_ = local_1320._4_4_ * fVar4;
        auVar38._0_4_ = local_1320._0_4_ * fVar77;
        auVar38._8_4_ = local_1320._8_4_ * fVar6;
        auVar38._12_4_ = local_1320._12_4_ * fVar8;
        auVar38._16_4_ = local_1320._16_4_ * fVar10;
        auVar38._20_4_ = local_1320._20_4_ * fVar12;
        auVar38._24_4_ = local_1320._24_4_ * fVar14;
        auVar38._28_4_ = auVar68._28_4_;
        auVar39._4_4_ = local_fc0._4_4_ * fVar149;
        auVar39._0_4_ = local_fc0._0_4_ * fVar147;
        auVar39._8_4_ = local_fc0._8_4_ * fVar150;
        auVar39._12_4_ = local_fc0._12_4_ * fVar151;
        auVar39._16_4_ = local_fc0._16_4_ * fVar152;
        auVar39._20_4_ = local_fc0._20_4_ * fVar153;
        auVar39._24_4_ = local_fc0._24_4_ * fVar154;
        auVar39._28_4_ = auVar72._28_4_;
        auVar99 = vfmsub213ps_fma(local_fc0,local_1040,auVar38);
        auVar40._4_4_ = fVar79 * auVar113._4_4_;
        auVar40._0_4_ = fVar78 * auVar113._0_4_;
        auVar40._8_4_ = fVar5 * auVar113._8_4_;
        auVar40._12_4_ = fVar7 * auVar113._12_4_;
        auVar40._16_4_ = fVar9 * auVar113._16_4_;
        auVar40._20_4_ = fVar11 * auVar113._20_4_;
        auVar40._24_4_ = fVar13 * auVar113._24_4_;
        auVar40._28_4_ = 0x34000000;
        auVar41._4_4_ = fVar149 * auVar124._4_4_;
        auVar41._0_4_ = fVar147 * auVar124._0_4_;
        auVar41._8_4_ = fVar150 * auVar124._8_4_;
        auVar41._12_4_ = fVar151 * auVar124._12_4_;
        auVar41._16_4_ = fVar152 * auVar124._16_4_;
        auVar41._20_4_ = fVar153 * auVar124._20_4_;
        auVar41._24_4_ = fVar154 * auVar124._24_4_;
        auVar41._28_4_ = auVar110._28_4_;
        auVar80 = vfmsub213ps_fma(auVar124,local_1020,auVar40);
        auVar72 = vandps_avx(auVar38,auVar91);
        auVar110 = vandps_avx(auVar40,auVar91);
        auVar72 = vcmpps_avx(auVar72,auVar110,1);
        local_1120 = vblendvps_avx(ZEXT1632(auVar80),ZEXT1632(auVar99),auVar72);
        auVar42._4_4_ = fVar4 * auVar135._4_4_;
        auVar42._0_4_ = fVar77 * auVar135._0_4_;
        auVar42._8_4_ = fVar6 * auVar135._8_4_;
        auVar42._12_4_ = fVar8 * auVar135._12_4_;
        auVar42._16_4_ = fVar10 * auVar135._16_4_;
        auVar42._20_4_ = fVar12 * auVar135._20_4_;
        auVar42._24_4_ = fVar14 * auVar135._24_4_;
        auVar42._28_4_ = auVar72._28_4_;
        auVar99 = vfmsub213ps_fma(auVar135,local_1040,auVar41);
        auVar43._4_4_ = local_1420._4_4_ * fVar79;
        auVar43._0_4_ = local_1420._0_4_ * fVar78;
        auVar43._8_4_ = local_1420._8_4_ * fVar5;
        auVar43._12_4_ = local_1420._12_4_ * fVar7;
        auVar43._16_4_ = local_1420._16_4_ * fVar9;
        auVar43._20_4_ = local_1420._20_4_ * fVar11;
        auVar43._24_4_ = local_1420._24_4_ * fVar13;
        auVar43._28_4_ = auVar110._28_4_;
        auVar80 = vfmsub213ps_fma(local_1320,auVar127,auVar43);
        auVar72 = vandps_avx(auVar43,auVar91);
        auVar110 = vandps_avx(auVar41,auVar91);
        auVar72 = vcmpps_avx(auVar72,auVar110,1);
        local_1100 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar80),auVar72);
        auVar99 = vfmsub213ps_fma(_local_1420,local_1020,auVar39);
        auVar80 = vfmsub213ps_fma(auVar113,auVar127,auVar42);
        auVar72 = vandps_avx(auVar39,auVar91);
        auVar110 = vandps_avx(auVar42,auVar91);
        auVar72 = vcmpps_avx(auVar72,auVar110,1);
        local_10e0 = vblendvps_avx(ZEXT1632(auVar80),ZEXT1632(auVar99),auVar72);
        auVar44._4_4_ = local_10e0._4_4_ * local_fe0;
        auVar44._0_4_ = local_10e0._0_4_ * local_fe0;
        auVar44._8_4_ = local_10e0._8_4_ * local_fe0;
        auVar44._12_4_ = local_10e0._12_4_ * local_fe0;
        auVar44._16_4_ = local_10e0._16_4_ * local_fe0;
        auVar44._20_4_ = local_10e0._20_4_ * local_fe0;
        auVar44._24_4_ = local_10e0._24_4_ * local_fe0;
        auVar44._28_4_ = auVar72._28_4_;
        auVar99 = vfmadd213ps_fma(local_13c0,local_1100,auVar44);
        auVar99 = vfmadd213ps_fma(local_1000,local_1120,ZEXT1632(auVar99));
        fVar107 = auVar99._0_4_ + auVar99._0_4_;
        fVar77 = auVar99._4_4_ + auVar99._4_4_;
        fVar78 = auVar99._8_4_ + auVar99._8_4_;
        fVar79 = auVar99._12_4_ + auVar99._12_4_;
        auVar113 = ZEXT1632(CONCAT412(fVar79,CONCAT48(fVar78,CONCAT44(fVar77,fVar107))));
        auVar45._4_4_ = local_10e0._4_4_ * fVar136;
        auVar45._0_4_ = local_10e0._0_4_ * auVar93._0_4_;
        auVar45._8_4_ = local_10e0._8_4_ * fVar137;
        auVar45._12_4_ = local_10e0._12_4_ * fVar138;
        auVar45._16_4_ = local_10e0._16_4_ * auVar87._0_4_;
        auVar45._20_4_ = local_10e0._20_4_ * fVar145;
        auVar45._24_4_ = local_10e0._24_4_ * fVar146;
        auVar45._28_4_ = 0x7fffffff;
        auVar99 = vfmadd213ps_fma(local_13e0,local_1100,auVar45);
        auVar72 = vrcpps_avx(auVar113);
        auVar80 = vfmadd213ps_fma(_local_14a0,local_1120,ZEXT1632(auVar99));
        auVar130._8_4_ = 0x3f800000;
        auVar130._0_8_ = 0x3f8000003f800000;
        auVar130._12_4_ = 0x3f800000;
        auVar130._16_4_ = 0x3f800000;
        auVar130._20_4_ = 0x3f800000;
        auVar130._24_4_ = 0x3f800000;
        auVar130._28_4_ = 0x3f800000;
        auVar99 = vfnmadd213ps_fma(auVar72,auVar113,auVar130);
        auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar72,auVar72);
        local_1140 = ZEXT1632(CONCAT412((auVar80._12_4_ + auVar80._12_4_) * auVar99._12_4_,
                                        CONCAT48((auVar80._8_4_ + auVar80._8_4_) * auVar99._8_4_,
                                                 CONCAT44((auVar80._4_4_ + auVar80._4_4_) *
                                                          auVar99._4_4_,
                                                          (auVar80._0_4_ + auVar80._0_4_) *
                                                          auVar99._0_4_))));
        uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
        auVar92._4_4_ = uVar67;
        auVar92._0_4_ = uVar67;
        auVar92._8_4_ = uVar67;
        auVar92._12_4_ = uVar67;
        auVar92._16_4_ = uVar67;
        auVar92._20_4_ = uVar67;
        auVar92._24_4_ = uVar67;
        auVar92._28_4_ = uVar67;
        auVar72 = vcmpps_avx(auVar92,local_1140,2);
        auVar93._0_4_ = (ray->super_RayK<1>).tfar;
        auVar111._4_4_ = auVar93._0_4_;
        auVar111._0_4_ = auVar93._0_4_;
        auVar111._8_4_ = auVar93._0_4_;
        auVar111._12_4_ = auVar93._0_4_;
        auVar111._16_4_ = auVar93._0_4_;
        auVar111._20_4_ = auVar93._0_4_;
        auVar111._24_4_ = auVar93._0_4_;
        auVar111._28_4_ = auVar93._0_4_;
        auVar110 = vcmpps_avx(local_1140,auVar111,2);
        auVar72 = vandps_avx(auVar110,auVar72);
        auVar112._0_8_ = CONCAT44(fVar77,fVar107) ^ 0x8000000080000000;
        auVar112._8_4_ = -fVar78;
        auVar112._12_4_ = -fVar79;
        auVar112._16_4_ = 0x80000000;
        auVar112._20_4_ = 0x80000000;
        auVar112._24_4_ = 0x80000000;
        auVar112._28_4_ = 0x80000000;
        auVar110 = vcmpps_avx(auVar113,auVar112,4);
        auVar72 = vandps_avx(auVar110,auVar72);
        auVar47._4_4_ = uStack_123c;
        auVar47._0_4_ = local_1240;
        auVar47._8_4_ = uStack_1238;
        auVar47._12_4_ = uStack_1234;
        auVar47._16_4_ = uStack_1230;
        auVar47._20_4_ = uStack_122c;
        auVar47._24_4_ = uStack_1228;
        auVar47._28_4_ = uStack_1224;
        auVar110 = vandps_avx(auVar68,auVar47);
        auVar72 = vpslld_avx2(auVar72,0x1f);
        auVar113 = vpsrad_avx2(auVar72,0x1f);
        auVar72 = auVar110 & auVar113;
        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar72 >> 0x7f,0) != '\0') ||
              (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0xbf,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar72[0x1f] < '\0') {
          uVar2 = *(uint *)(local_14a8 + 0x18);
          auVar63 = (undefined1  [8])CONCAT44(0,uVar2);
          local_13a0._0_4_ = *(uint *)(local_14a8 + 0x1c);
          local_13a0._4_28_ = auVar68._4_28_;
          auVar72 = vandps_avx(auVar113,auVar110);
          uVar56 = vextractps_avx(SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0),1);
          uStack_1210 = 0;
          uStack_1208 = 0;
          local_1200 = ZEXT1632(auVar81);
          local_11c0 = &local_1338;
          local_11a0 = auVar72;
          pGVar55 = (context->scene->geometries).items[(long)auVar63].ptr;
          if ((pGVar55->mask & uVar56) != 0) {
            local_1300 = auVar72;
            auVar68 = vrcpps_avx(local_11e0);
            auVar106._8_4_ = 0x3f800000;
            auVar106._0_8_ = 0x3f8000003f800000;
            auVar106._12_4_ = 0x3f800000;
            auVar106._16_4_ = 0x3f800000;
            auVar106._20_4_ = 0x3f800000;
            auVar106._24_4_ = 0x3f800000;
            auVar106._28_4_ = 0x3f800000;
            auVar99 = vfnmadd213ps_fma(local_11e0,auVar68,auVar106);
            auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar68,auVar68);
            auVar73._8_4_ = 0x219392ef;
            auVar73._0_8_ = 0x219392ef219392ef;
            auVar73._12_4_ = 0x219392ef;
            auVar73._16_4_ = 0x219392ef;
            auVar73._20_4_ = 0x219392ef;
            auVar73._24_4_ = 0x219392ef;
            auVar73._28_4_ = 0x219392ef;
            auVar110 = vcmpps_avx(local_1080,auVar73,5);
            auVar68 = vandps_avx(auVar110,ZEXT1632(auVar99));
            auVar46._4_4_ = auVar68._4_4_ * local_1220._4_4_;
            auVar46._0_4_ = auVar68._0_4_ * local_1220._0_4_;
            auVar46._8_4_ = auVar68._8_4_ * local_1220._8_4_;
            auVar46._12_4_ = auVar68._12_4_ * local_1220._12_4_;
            auVar46._16_4_ = auVar68._16_4_ * 0.0;
            auVar46._20_4_ = auVar68._20_4_ * 0.0;
            auVar46._24_4_ = auVar68._24_4_ * 0.0;
            auVar46._28_4_ = auVar110._28_4_;
            auVar110 = vminps_avx(auVar46,auVar106);
            auVar85._0_4_ = auVar68._0_4_ * auVar81._0_4_;
            auVar85._4_4_ = auVar68._4_4_ * auVar81._4_4_;
            auVar85._8_4_ = auVar68._8_4_ * auVar81._8_4_;
            auVar85._12_4_ = auVar68._12_4_ * auVar81._12_4_;
            auVar85._16_4_ = auVar68._16_4_ * 0.0;
            auVar85._20_4_ = auVar68._20_4_ * 0.0;
            auVar85._24_4_ = auVar68._24_4_ * 0.0;
            auVar85._28_4_ = 0;
            auVar68 = vminps_avx(auVar85,auVar106);
            auVar81 = *(undefined1 (*) [16])(*local_1338 + local_1330 * 4);
            auVar99 = auVar81;
            if (2 < uVar49) {
              auVar99 = *(undefined1 (*) [16])(*local_1338 + local_1330 * 8);
            }
            auVar80 = *local_1338;
            if (uVar52 == 2) {
              auVar80 = vpshufd_avx(auVar80,0x54);
              auVar81 = vpshufd_avx(auVar81,0x54);
              auVar99 = vpshufd_avx(auVar99,0x54);
            }
            auVar114._0_16_ = ZEXT116(0) * auVar81 + ZEXT116(1) * auVar80;
            auVar114._16_16_ = ZEXT116(1) * auVar81;
            auVar98._0_16_ = ZEXT116(0) * auVar99 + ZEXT116(1) * auVar81;
            auVar98._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar99;
            auVar113 = vpunpckldq_avx2(auVar114,auVar98);
            auVar121 = vpshufd_avx2(auVar114,0xa5);
            auVar135 = vpshufd_avx2(auVar98,0x94);
            auVar124 = vpsrld_avx2(auVar113,0x10);
            auVar113 = vpblendw_avx2(auVar113,ZEXT832(0) << 0x20,0xaa);
            auVar113 = vcvtdq2ps_avx(auVar113);
            auVar124 = vcvtdq2ps_avx(auVar124);
            auVar127 = vpsrld_avx2(auVar121,0x10);
            auVar121 = vpblendw_avx2(auVar121,ZEXT832(0) << 0x20,0xaa);
            auVar121 = vcvtdq2ps_avx(auVar121);
            auVar127 = vcvtdq2ps_avx(auVar127);
            auVar131 = vpsrld_avx2(auVar135,0x10);
            auVar135 = vpblendw_avx2(auVar135,ZEXT832(0) << 0x20,0xaa);
            auVar135 = vcvtdq2ps_avx(auVar135);
            auVar131 = vcvtdq2ps_avx(auVar131);
            auVar128._8_4_ = 0x3f800000;
            auVar128._0_8_ = 0x3f8000003f800000;
            auVar128._12_4_ = 0x3f800000;
            auVar128._16_4_ = 0x3f800000;
            auVar128._20_4_ = 0x3f800000;
            auVar128._24_4_ = 0x3f800000;
            auVar128._28_4_ = 0x3f800000;
            auVar122 = vsubps_avx(auVar128,auVar110);
            auVar122 = vsubps_avx(auVar122,auVar68);
            local_1180[1] =
                 auVar68._4_4_ * auVar135._4_4_ * 0.00012207031 +
                 auVar110._4_4_ * auVar121._4_4_ * 0.00012207031 +
                 auVar122._4_4_ * auVar113._4_4_ * 0.00012207031;
            local_1180[0] =
                 auVar68._0_4_ * auVar135._0_4_ * 0.00012207031 +
                 auVar110._0_4_ * auVar121._0_4_ * 0.00012207031 +
                 auVar122._0_4_ * auVar113._0_4_ * 0.00012207031;
            local_1180[2] =
                 auVar68._8_4_ * auVar135._8_4_ * 0.00012207031 +
                 auVar110._8_4_ * auVar121._8_4_ * 0.00012207031 +
                 auVar122._8_4_ * auVar113._8_4_ * 0.00012207031;
            local_1180[3] =
                 auVar68._12_4_ * auVar135._12_4_ * 0.00012207031 +
                 auVar110._12_4_ * auVar121._12_4_ * 0.00012207031 +
                 auVar122._12_4_ * auVar113._12_4_ * 0.00012207031;
            fStack_1170 = auVar68._16_4_ * auVar135._16_4_ * 0.00012207031 +
                          auVar110._16_4_ * auVar121._16_4_ * 0.00012207031 +
                          auVar122._16_4_ * auVar113._16_4_ * 0.00012207031;
            fStack_116c = auVar68._20_4_ * auVar135._20_4_ * 0.00012207031 +
                          auVar110._20_4_ * auVar121._20_4_ * 0.00012207031 +
                          auVar122._20_4_ * auVar113._20_4_ * 0.00012207031;
            fStack_1168 = auVar68._24_4_ * auVar135._24_4_ * 0.00012207031 +
                          auVar110._24_4_ * auVar121._24_4_ * 0.00012207031 +
                          auVar122._24_4_ * auVar113._24_4_ * 0.00012207031;
            fStack_1164 = auVar135._28_4_ + auVar121._28_4_ + auVar68._28_4_;
            local_1160[1] =
                 auVar131._4_4_ * 0.00012207031 * auVar68._4_4_ +
                 auVar110._4_4_ * auVar127._4_4_ * 0.00012207031 +
                 auVar122._4_4_ * auVar124._4_4_ * 0.00012207031;
            local_1160[0] =
                 auVar131._0_4_ * 0.00012207031 * auVar68._0_4_ +
                 auVar110._0_4_ * auVar127._0_4_ * 0.00012207031 +
                 auVar122._0_4_ * auVar124._0_4_ * 0.00012207031;
            local_1160[2] =
                 auVar131._8_4_ * 0.00012207031 * auVar68._8_4_ +
                 auVar110._8_4_ * auVar127._8_4_ * 0.00012207031 +
                 auVar122._8_4_ * auVar124._8_4_ * 0.00012207031;
            local_1160[3] =
                 auVar131._12_4_ * 0.00012207031 * auVar68._12_4_ +
                 auVar110._12_4_ * auVar127._12_4_ * 0.00012207031 +
                 auVar122._12_4_ * auVar124._12_4_ * 0.00012207031;
            fStack_1150 = auVar131._16_4_ * 0.00012207031 * auVar68._16_4_ +
                          auVar110._16_4_ * auVar127._16_4_ * 0.00012207031 +
                          auVar122._16_4_ * auVar124._16_4_ * 0.00012207031;
            fStack_114c = auVar131._20_4_ * 0.00012207031 * auVar68._20_4_ +
                          auVar110._20_4_ * auVar127._20_4_ * 0.00012207031 +
                          auVar122._20_4_ * auVar124._20_4_ * 0.00012207031;
            fStack_1148 = auVar131._24_4_ * 0.00012207031 * auVar68._24_4_ +
                          auVar110._24_4_ * auVar127._24_4_ * 0.00012207031 +
                          auVar122._24_4_ * auVar124._24_4_ * 0.00012207031;
            fStack_1144 = auVar121._28_4_ + auVar127._28_4_ + auVar122._28_4_;
            auVar74._8_4_ = 0x7f800000;
            auVar74._0_8_ = 0x7f8000007f800000;
            auVar74._12_4_ = 0x7f800000;
            auVar74._16_4_ = 0x7f800000;
            auVar74._20_4_ = 0x7f800000;
            auVar74._24_4_ = 0x7f800000;
            auVar74._28_4_ = 0x7f800000;
            auVar68 = vblendvps_avx(auVar74,local_1140,auVar72);
            auVar110 = vshufps_avx(auVar68,auVar68,0xb1);
            auVar110 = vminps_avx(auVar68,auVar110);
            auVar113 = vshufpd_avx(auVar110,auVar110,5);
            auVar110 = vminps_avx(auVar110,auVar113);
            auVar113 = vpermpd_avx2(auVar110,0x4e);
            auVar110 = vminps_avx(auVar110,auVar113);
            auVar68 = vcmpps_avx(auVar68,auVar110,0);
            auVar110 = auVar72 & auVar68;
            if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar110 >> 0x7f,0) != '\0') ||
                  (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0xbf,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar110[0x1f] < '\0') {
              auVar72 = vandps_avx(auVar68,auVar72);
            }
            uVar49 = vmovmskps_avx(auVar72);
            uVar52 = 0;
            for (; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x80000000) {
              uVar52 = uVar52 + 1;
            }
            uVar61 = (ulong)uVar52;
            local_13c0._0_8_ = context->args;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar55->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              _local_14a0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_13e0 = local_1140;
              local_1400._0_8_ = context->user;
              local_1420 = auVar63;
              local_1320._0_8_ = pGVar55;
              do {
                local_1374 = local_1180[uVar61];
                local_1370 = local_1160[uVar61];
                (ray->super_RayK<1>).tfar = *(float *)(local_1140 + uVar61 * 4);
                local_1380 = *(float *)(local_1120 + uVar61 * 4);
                local_137c = *(undefined4 *)(local_1100 + uVar61 * 4);
                local_1378 = *(undefined4 *)(local_10e0 + uVar61 * 4);
                local_136c = local_13a0._0_4_;
                local_1368 = SUB84(auVar63,0);
                local_1364 = *(uint *)local_1400._0_8_;
                local_1360 = *(uint *)(local_1400._0_8_ + 4);
                local_14ac = -1;
                local_1450.valid = &local_14ac;
                local_1450.geometryUserPtr = pGVar55->userPtr;
                local_1450.context = (RTCRayQueryContext *)local_1400._0_8_;
                local_1450.ray = (RTCRayN *)ray;
                local_1450.hit = (RTCHitN *)&local_1380;
                local_1450.N = 1;
                local_1480._0_8_ = uVar61;
                if (pGVar55->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0149a43b:
                  if ((*(code **)(local_13c0._0_8_ + 0x10) != (code *)0x0) &&
                     (((*(byte *)local_13c0._0_8_ & 2) != 0 ||
                      (((pGVar55->field_8).field_0x2 & 0x40) != 0)))) {
                    (**(code **)(local_13c0._0_8_ + 0x10))(&local_1450);
                    pGVar55 = (Geometry *)local_1320._0_8_;
                    uVar61 = local_1480._0_8_;
                    auVar63 = local_1420;
                    if (*local_1450.valid == 0) goto LAB_0149a4f8;
                  }
                  (((Vec3f *)((long)local_1450.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_1450.hit;
                  (((Vec3f *)((long)local_1450.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_1450.hit + 4);
                  (((Vec3f *)((long)local_1450.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_1450.hit + 8);
                  *(float *)((long)local_1450.ray + 0x3c) = *(float *)(local_1450.hit + 0xc);
                  *(float *)((long)local_1450.ray + 0x40) = *(float *)(local_1450.hit + 0x10);
                  *(float *)((long)local_1450.ray + 0x44) = *(float *)(local_1450.hit + 0x14);
                  *(float *)((long)local_1450.ray + 0x48) = *(float *)(local_1450.hit + 0x18);
                  *(float *)((long)local_1450.ray + 0x4c) = *(float *)(local_1450.hit + 0x1c);
                  *(float *)((long)local_1450.ray + 0x50) = *(float *)(local_1450.hit + 0x20);
                }
                else {
                  (*pGVar55->intersectionFilterN)(&local_1450);
                  pGVar55 = (Geometry *)local_1320._0_8_;
                  uVar61 = local_1480._0_8_;
                  auVar63 = local_1420;
                  if (*local_1450.valid != 0) goto LAB_0149a43b;
LAB_0149a4f8:
                  (ray->super_RayK<1>).tfar = (float)local_14a0._0_4_;
                  pGVar55 = (Geometry *)local_1320._0_8_;
                  uVar61 = local_1480._0_8_;
                  auVar63 = local_1420;
                }
                *(undefined4 *)(local_1300 + uVar61 * 4) = 0;
                auVar110 = local_1300;
                auVar93._0_4_ = (ray->super_RayK<1>).tfar;
                auVar75._4_4_ = auVar93._0_4_;
                auVar75._0_4_ = auVar93._0_4_;
                auVar75._8_4_ = auVar93._0_4_;
                auVar75._12_4_ = auVar93._0_4_;
                auVar75._16_4_ = auVar93._0_4_;
                auVar75._20_4_ = auVar93._0_4_;
                auVar75._24_4_ = auVar93._0_4_;
                auVar75._28_4_ = auVar93._0_4_;
                auVar68 = vcmpps_avx(local_13e0,auVar75,2);
                auVar72 = vandps_avx(auVar68,local_1300);
                local_1300 = auVar72;
                auVar110 = auVar110 & auVar68;
                if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar110 >> 0x7f,0) == '\0') &&
                      (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar110 >> 0xbf,0) == '\0') &&
                    (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar110[0x1f]) goto LAB_0149a26e;
                auVar86._8_4_ = 0x7f800000;
                auVar86._0_8_ = 0x7f8000007f800000;
                auVar86._12_4_ = 0x7f800000;
                auVar86._16_4_ = 0x7f800000;
                auVar86._20_4_ = 0x7f800000;
                auVar86._24_4_ = 0x7f800000;
                auVar86._28_4_ = 0x7f800000;
                auVar68 = vblendvps_avx(auVar86,local_13e0,auVar72);
                auVar110 = vshufps_avx(auVar68,auVar68,0xb1);
                auVar110 = vminps_avx(auVar68,auVar110);
                auVar113 = vshufpd_avx(auVar110,auVar110,5);
                auVar110 = vminps_avx(auVar110,auVar113);
                auVar113 = vpermpd_avx2(auVar110,0x4e);
                auVar110 = vminps_avx(auVar110,auVar113);
                auVar68 = vcmpps_avx(auVar68,auVar110,0);
                auVar110 = auVar72 & auVar68;
                _local_14a0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar110 >> 0x7f,0) != '\0') ||
                      (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar110 >> 0xbf,0) != '\0') ||
                    (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar110[0x1f] < '\0') {
                  auVar72 = vandps_avx(auVar68,auVar72);
                }
                uVar49 = vmovmskps_avx(auVar72);
                uVar52 = 0;
                for (; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x80000000) {
                  uVar52 = uVar52 + 1;
                }
                uVar61 = (ulong)uVar52;
              } while( true );
            }
            auVar93._0_4_ = local_1180[uVar61];
            fVar136 = local_1160[uVar61];
            fVar137 = *(float *)(local_1120 + uVar61 * 4);
            fVar138 = *(float *)(local_1100 + uVar61 * 4);
            auVar87._0_4_ = *(float *)(local_10e0 + uVar61 * 4);
            (ray->super_RayK<1>).tfar = *(float *)(local_1140 + uVar61 * 4);
            (ray->Ng).field_0.field_0.x = fVar137;
            (ray->Ng).field_0.field_0.y = fVar138;
            (ray->Ng).field_0.field_0.z = auVar87._0_4_;
            ray->u = auVar93._0_4_;
            ray->v = fVar136;
            ray->primID = local_13a0._0_4_;
            ray->geomID = uVar2;
            pRVar3 = context->user;
            ray->instID[0] = pRVar3->instID[0];
            ray->instPrimID[0] = pRVar3->instPrimID[0];
          }
        }
      }
LAB_0149a26e:
      auVar93._0_4_ = (ray->super_RayK<1>).tfar;
      auVar76 = ZEXT1664(CONCAT412(auVar93._0_4_,
                                   CONCAT48(auVar93._0_4_,CONCAT44(auVar93._0_4_,auVar93._0_4_))));
      auVar129 = ZEXT1664(local_1250);
      auVar132 = ZEXT1664(local_1260);
      auVar134 = ZEXT1664(local_1270);
      auVar140 = ZEXT1664(local_1290);
      auVar143 = ZEXT1664(local_12a0);
      auVar148 = ZEXT1664(local_12c0);
      auVar155 = ZEXT1664(local_12d0);
      auVar125 = ZEXT1664(local_1350);
      auVar93._0_4_ = local_1280;
      fVar136 = fStack_127c;
      fVar137 = fStack_1278;
      fVar138 = fStack_1274;
      auVar87._0_4_ = local_12b0;
      fVar145 = fStack_12ac;
      fVar146 = fStack_12a8;
      fVar107 = fStack_12a4;
      goto LAB_01499609;
    }
    local_14a8 = *(long *)(uVar61 & 0xfffffffffffffff0);
    fVar77 = (float)(*(int *)(local_14a8 + 8) - 1);
    local_10a0 = fVar77 * (ray->super_RayK<1>).dir.field_0.m128[3];
    auVar81 = vroundss_avx(ZEXT416((uint)local_10a0),ZEXT416((uint)local_10a0),9);
    auVar81 = vminss_avx(auVar81,ZEXT416((uint)(fVar77 + -1.0)));
    auVar81 = vmaxss_avx(ZEXT816(0) << 0x20,auVar81);
    local_10a0 = local_10a0 - auVar81._0_4_;
    iVar50 = (int)auVar81._0_4_;
    lVar20 = *(long *)(local_14a8 + 0x30 + (ulong)*(uint *)(local_14a8 + 0x2c) + (long)iVar50 * 8);
    fVar77 = (ray->super_RayK<1>).tfar;
    auVar76 = ZEXT1664(CONCAT412(fVar77,CONCAT48(fVar77,CONCAT44(fVar77,fVar77))));
    if (lVar20 != 0) {
      *(long *)*pauVar59 = lVar20;
      *(undefined4 *)(*pauVar59 + 8) = 0;
      pauVar59 = pauVar59 + 1;
    }
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }